

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::SwiftGetVersionCommand::getVerboseDescription
          (SwiftGetVersionCommand *this,SmallVectorImpl<char> *result)

{
  raw_ostream *prVar1;
  raw_svector_ostream rStack_48;
  
  llvm::raw_svector_ostream::raw_svector_ostream(&rStack_48,result);
  prVar1 = llvm::raw_ostream::operator<<((raw_ostream *)&rStack_48,'\"');
  prVar1 = llvm::raw_ostream::operator<<(prVar1,&this->executable);
  prVar1 = llvm::raw_ostream::operator<<(prVar1,'\"');
  llvm::raw_ostream::operator<<(prVar1," --version");
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&rStack_48);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << '"' << executable << '"'
                                      << " --version";
  }